

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsBody.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsBodyTranslation::ConstraintsLoadJacobians(ChShaftsBodyTranslation *this)

{
  Scalar *pSVar1;
  ChConstraintTwoGeneric *this_00;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
  local_70 [32];
  ChVector<double> jacw;
  ChVector<double> jacx;
  
  ChMatrix33<double>::operator*
            (&(this->body->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix,
             &this->shaft_dir);
  Vcross<double,double>(&this->shaft_pos,&this->shaft_dir);
  this_00 = &this->constraint;
  ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)local_70,this_00);
  pSVar1 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_70,0);
  *pSVar1 = (Scalar)&DAT_bff0000000000000;
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)local_70,this_00);
  pSVar1 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_70,0);
  *pSVar1 = jacx.m_data[0];
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)local_70,this_00);
  pSVar1 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_70,1);
  *pSVar1 = jacx.m_data[1];
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)local_70,this_00);
  pSVar1 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_70,2);
  *pSVar1 = jacx.m_data[2];
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)local_70,this_00);
  pSVar1 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_70,3);
  *pSVar1 = jacw.m_data[0];
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)local_70,this_00);
  pSVar1 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_70,4);
  *pSVar1 = jacw.m_data[1];
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)local_70,this_00);
  pSVar1 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_70,5);
  *pSVar1 = jacw.m_data[2];
  return;
}

Assistant:

void ChShaftsBodyTranslation::ConstraintsLoadJacobians() {
    // compute jacobians
    ChVector<> jacx = body->TransformDirectionLocalToParent(shaft_dir);
    ChVector<> jacw = Vcross(shaft_pos, shaft_dir);

    constraint.Get_Cq_a()(0) = -1.0;

    constraint.Get_Cq_b()(0) = jacx.x();
    constraint.Get_Cq_b()(1) = jacx.y();
    constraint.Get_Cq_b()(2) = jacx.z();
    constraint.Get_Cq_b()(3) = jacw.x();
    constraint.Get_Cq_b()(4) = jacw.y();
    constraint.Get_Cq_b()(5) = jacw.z();
}